

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

DeepFrameBuffer * __thiscall Imf_3_4::DeepTiledInputFile::frameBuffer(DeepTiledInputFile *this)

{
  element_type *peVar1;
  int iVar2;
  mutex *__mutex;
  
  __mutex = &((this->_data).
              super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_mx;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    peVar1 = (this->_data).
             super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return &peVar1->frameBuffer;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

const DeepFrameBuffer&
DeepTiledInputFile::frameBuffer () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    return _data->frameBuffer;
}